

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O1

char * archive_entry_copy_fflags_text(archive_entry *entry,char *flags)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  byte *pbVar6;
  size_t sVar7;
  char *__s;
  size_t __n;
  byte *pbVar8;
  unsigned_long *puVar9;
  bool bVar10;
  unsigned_long local_60;
  unsigned_long local_58;
  
  archive_mstring_copy_mbs(&entry->ae_fflags_text,flags);
  do {
    bVar1 = *flags;
    if (bVar1 < 0x20) {
      if (bVar1 != 9) {
        if (bVar1 == 0) {
          local_58 = 0;
          local_60 = 0;
          pbVar6 = (byte *)0x0;
          goto LAB_00493f9c;
        }
LAB_00493e4c:
        pbVar6 = (byte *)0x0;
        local_60 = 0;
        local_58 = 0;
        do {
          __n = 0;
          while ((0x2c < (ulong)((byte *)flags)[__n] ||
                 ((0x100100000201U >> ((ulong)((byte *)flags)[__n] & 0x3f) & 1) == 0))) {
            __n = __n + 1;
          }
          pbVar8 = (byte *)flags + __n;
          bVar10 = false;
          puVar9 = &::flags[0].set;
          __s = "nosappnd";
          do {
            sVar7 = strlen(__s);
            if ((sVar7 == __n) && (iVar5 = bcmp(flags,__s,__n), iVar5 == 0)) {
              uVar3 = *puVar9;
              uVar2 = puVar9[1];
LAB_00493f31:
              local_58 = local_58 | uVar2;
              local_60 = local_60 | uVar3;
              bVar4 = false;
            }
            else {
              bVar4 = true;
              if ((sVar7 - 2 == __n) && (iVar5 = bcmp(flags,__s + 2,__n), iVar5 == 0)) {
                uVar2 = *puVar9;
                uVar3 = puVar9[1];
                goto LAB_00493f31;
              }
            }
            if (!bVar4) break;
            __s = (char *)puVar9[2];
            puVar9 = puVar9 + 4;
            bVar10 = __s == (char *)0x0;
          } while (!bVar10);
          while( true ) {
            bVar1 = *pbVar8;
            if ((0x2c < (ulong)bVar1) || ((0x100100000200U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
            break;
            pbVar8 = pbVar8 + 1;
          }
          if (pbVar6 != (byte *)0x0) {
            flags = (char *)pbVar6;
          }
          if (bVar10) {
            pbVar6 = (byte *)flags;
          }
          flags = (char *)pbVar8;
        } while (bVar1 != 0);
LAB_00493f9c:
        entry->ae_fflags_set = local_58;
        entry->ae_fflags_clear = local_60;
        return (char *)pbVar6;
      }
    }
    else if ((bVar1 != 0x20) && (bVar1 != 0x2c)) goto LAB_00493e4c;
    flags = (char *)((byte *)flags + 1);
  } while( true );
}

Assistant:

const char *
archive_entry_copy_fflags_text(struct archive_entry *entry,
    const char *flags)
{
	archive_mstring_copy_mbs(&entry->ae_fflags_text, flags);
	return (ae_strtofflags(flags,
		    &entry->ae_fflags_set, &entry->ae_fflags_clear));
}